

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_DoublingFactorCounterTest_BigThreeDragons_Test::testBody
          (TEST_DoublingFactorCounterTest_BigThreeDragons_Test *this)

{
  PlayerHand *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  int value;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  SimpleString local_b8;
  SimpleString local_b0;
  TestTerminatorWithoutExceptions local_a8;
  DoublingFactorReport r;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h;
  mahjong::PlayerHand::add(this_00,WestWind);
  mahjong::PlayerHand::add(this_00,WestWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,WhiteDragon,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,RedDragon,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,GreenDragon,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfCharacters,false);
  mahjong::WiningState::selfDrawn
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,
             (SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            (&r,&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  p_Var1 = &r.patterns._M_t._M_impl.super__Rb_tree_header;
  value = (int)&local_b8;
  p_Var9 = &p_Var1->_M_header;
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
  goto LAB_00172969;
  do {
    p_Var8 = p_Var10;
    p_Var13 = p_Var9;
    _Var2 = p_Var8[1]._M_color;
    p_Var9 = p_Var8;
    if ((int)_Var2 < 0x2d) {
      p_Var9 = p_Var13;
    }
    p_Var10 = (&p_Var8->_M_left)[(int)_Var2 < 0x2d];
  } while ((&p_Var8->_M_left)[(int)_Var2 < 0x2d] != (_Base_ptr)0x0);
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
LAB_0017286f:
    do {
      p_Var12 = (_Rb_tree_header *)p_Var11;
      p_Var9 = p_Var10;
      iVar3 = (int)*(size_t *)(p_Var9 + 1);
      p_Var11 = p_Var9;
      if (iVar3 < 0x2d) {
        p_Var11 = &p_Var12->_M_header;
      }
      p_Var10 = (&p_Var9->_M_left)[iVar3 < 0x2d];
    } while ((&p_Var9->_M_left)[iVar3 < 0x2d] != (_Base_ptr)0x0);
    p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &p_Var1->_M_header;
    p_Var7 = p_Var1;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      if (iVar3 < 0x2d) {
        p_Var9 = &p_Var12->_M_header;
      }
      p_Var7 = (_Rb_tree_header *)p_Var11;
      if (0x2d < (int)((_Rb_tree_header *)p_Var9)->_M_node_count) {
        p_Var7 = p_Var1;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var8;
      p_Var9 = p_Var10;
      iVar3 = (int)*(size_t *)(p_Var9 + 1);
      p_Var8 = p_Var9;
      if (iVar3 < 0x2d) {
        p_Var8 = &p_Var12->_M_header;
      }
      p_Var10 = (&p_Var9->_M_left)[iVar3 < 0x2d];
    } while ((&p_Var9->_M_left)[iVar3 < 0x2d] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var8 == p_Var1) {
      if (p_Var7 != p_Var1) goto LAB_00172944;
    }
    else {
      if (iVar3 < 0x2d) {
        p_Var9 = &p_Var12->_M_header;
      }
      if (0x2d < (int)((_Rb_tree_header *)p_Var9)->_M_node_count == (p_Var7 != p_Var1)) {
LAB_00172944:
        pUVar4 = UtestShell::getCurrent();
        (*pUVar4->_vptr_UtestShell[0x1b])
                  (pUVar4,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x335);
      }
    }
LAB_00172969:
    pUVar4 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_b8);
    for (p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 0x2d]) {
    }
    StringFrom((unsigned_long)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x335,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  else {
    if ((int)_Var2 < 0x2d) {
      p_Var8 = p_Var13;
    }
    if (0x2d < (int)p_Var8[1]._M_color) goto LAB_0017286f;
    pUVar4 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x335,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  p_Var9 = &p_Var1->_M_header;
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00172a9d:
    pUVar4 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x336,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    do {
      p_Var8 = p_Var10;
      p_Var13 = p_Var9;
      _Var2 = p_Var8[1]._M_color;
      p_Var9 = p_Var8;
      if ((int)_Var2 < 0xb) {
        p_Var9 = p_Var13;
      }
      p_Var10 = (&p_Var8->_M_left)[(int)_Var2 < 0xb];
    } while ((&p_Var8->_M_left)[(int)_Var2 < 0xb] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 == p_Var1) goto LAB_00172a9d;
    if ((int)_Var2 < 0xb) {
      p_Var8 = p_Var13;
    }
    p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = &p_Var1->_M_header;
    if (0xb < (int)p_Var8[1]._M_color) goto LAB_00172a9d;
    do {
      p_Var12 = (_Rb_tree_header *)p_Var10;
      p_Var8 = p_Var9;
      iVar3 = (int)*(size_t *)(p_Var8 + 1);
      p_Var10 = p_Var8;
      if (iVar3 < 0xb) {
        p_Var10 = &p_Var12->_M_header;
      }
      p_Var9 = (&p_Var8->_M_left)[iVar3 < 0xb];
    } while ((&p_Var8->_M_left)[iVar3 < 0xb] != (_Base_ptr)0x0);
    p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    p_Var7 = p_Var1;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      if (iVar3 < 0xb) {
        p_Var8 = &p_Var12->_M_header;
      }
      p_Var7 = (_Rb_tree_header *)p_Var10;
      if (0xb < (int)((_Rb_tree_header *)p_Var8)->_M_node_count) {
        p_Var7 = p_Var1;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var13;
      p_Var10 = p_Var9;
      iVar3 = (int)*(size_t *)(p_Var10 + 1);
      p_Var13 = p_Var10;
      if (iVar3 < 0xb) {
        p_Var13 = &p_Var12->_M_header;
      }
      p_Var9 = (&p_Var10->_M_left)[iVar3 < 0xb];
    } while ((&p_Var10->_M_left)[iVar3 < 0xb] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      if (p_Var7 != p_Var1) goto LAB_00172f01;
    }
    else {
      if (iVar3 < 0xb) {
        p_Var10 = &p_Var12->_M_header;
      }
      if (0xb < (int)((_Rb_tree_header *)p_Var10)->_M_node_count == (p_Var7 != p_Var1)) {
LAB_00172f01:
        pUVar4 = UtestShell::getCurrent();
        (*pUVar4->_vptr_UtestShell[0x1b])
                  (pUVar4,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x336);
      }
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_b8);
    for (p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 0xb]) {
    }
    StringFrom((unsigned_long)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x336,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  p_Var9 = &p_Var1->_M_header;
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00172b30:
    pUVar4 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x337,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    do {
      p_Var8 = p_Var10;
      p_Var13 = p_Var9;
      _Var2 = p_Var8[1]._M_color;
      p_Var9 = p_Var8;
      if ((int)_Var2 < 0xd) {
        p_Var9 = p_Var13;
      }
      p_Var10 = (&p_Var8->_M_left)[(int)_Var2 < 0xd];
    } while ((&p_Var8->_M_left)[(int)_Var2 < 0xd] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 == p_Var1) goto LAB_00172b30;
    if ((int)_Var2 < 0xd) {
      p_Var8 = p_Var13;
    }
    p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = &p_Var1->_M_header;
    if (0xd < (int)p_Var8[1]._M_color) goto LAB_00172b30;
    do {
      p_Var12 = (_Rb_tree_header *)p_Var10;
      p_Var8 = p_Var9;
      iVar3 = (int)*(size_t *)(p_Var8 + 1);
      p_Var10 = p_Var8;
      if (iVar3 < 0xd) {
        p_Var10 = &p_Var12->_M_header;
      }
      p_Var9 = (&p_Var8->_M_left)[iVar3 < 0xd];
    } while ((&p_Var8->_M_left)[iVar3 < 0xd] != (_Base_ptr)0x0);
    p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    p_Var7 = p_Var1;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      if (iVar3 < 0xd) {
        p_Var8 = &p_Var12->_M_header;
      }
      p_Var7 = (_Rb_tree_header *)p_Var10;
      if (0xd < (int)((_Rb_tree_header *)p_Var8)->_M_node_count) {
        p_Var7 = p_Var1;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var13;
      p_Var10 = p_Var9;
      iVar3 = (int)*(size_t *)(p_Var10 + 1);
      p_Var13 = p_Var10;
      if (iVar3 < 0xd) {
        p_Var13 = &p_Var12->_M_header;
      }
      p_Var9 = (&p_Var10->_M_left)[iVar3 < 0xd];
    } while ((&p_Var10->_M_left)[iVar3 < 0xd] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      if (p_Var7 != p_Var1) goto LAB_00173016;
    }
    else {
      if (iVar3 < 0xd) {
        p_Var10 = &p_Var12->_M_header;
      }
      if (0xd < (int)((_Rb_tree_header *)p_Var10)->_M_node_count == (p_Var7 != p_Var1)) {
LAB_00173016:
        pUVar4 = UtestShell::getCurrent();
        (*pUVar4->_vptr_UtestShell[0x1b])
                  (pUVar4,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x337);
      }
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_b8);
    for (p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 0xd]) {
    }
    StringFrom((unsigned_long)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x337,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  p_Var9 = &p_Var1->_M_header;
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var8 = p_Var10;
      p_Var13 = p_Var9;
      _Var2 = p_Var8[1]._M_color;
      p_Var9 = p_Var8;
      if ((int)_Var2 < 0xc) {
        p_Var9 = p_Var13;
      }
      p_Var10 = (&p_Var8->_M_left)[(int)_Var2 < 0xc];
    } while ((&p_Var8->_M_left)[(int)_Var2 < 0xc] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      if ((int)_Var2 < 0xc) {
        p_Var8 = p_Var13;
      }
      p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      if ((int)p_Var8[1]._M_color < 0xd) {
        do {
          p_Var12 = (_Rb_tree_header *)p_Var10;
          p_Var8 = p_Var9;
          iVar3 = (int)*(size_t *)(p_Var8 + 1);
          p_Var10 = p_Var8;
          if (iVar3 < 0xc) {
            p_Var10 = &p_Var12->_M_header;
          }
          p_Var9 = (&p_Var8->_M_left)[iVar3 < 0xc];
        } while ((&p_Var8->_M_left)[iVar3 < 0xc] != (_Base_ptr)0x0);
        p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = &p_Var1->_M_header;
        p_Var7 = p_Var1;
        if ((_Rb_tree_header *)p_Var10 != p_Var1) {
          if (iVar3 < 0xc) {
            p_Var8 = &p_Var12->_M_header;
          }
          p_Var7 = (_Rb_tree_header *)p_Var10;
          if (0xc < (int)((_Rb_tree_header *)p_Var8)->_M_node_count) {
            p_Var7 = p_Var1;
          }
        }
        do {
          p_Var12 = (_Rb_tree_header *)p_Var13;
          p_Var10 = p_Var9;
          iVar3 = (int)*(size_t *)(p_Var10 + 1);
          p_Var13 = p_Var10;
          if (iVar3 < 0xc) {
            p_Var13 = &p_Var12->_M_header;
          }
          p_Var9 = (&p_Var10->_M_left)[iVar3 < 0xc];
        } while ((&p_Var10->_M_left)[iVar3 < 0xc] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var13 == p_Var1) {
          if (p_Var7 != p_Var1) goto LAB_0017312b;
        }
        else {
          if (iVar3 < 0xc) {
            p_Var10 = &p_Var12->_M_header;
          }
          if (0xc < (int)((_Rb_tree_header *)p_Var10)->_M_node_count == (p_Var7 != p_Var1)) {
LAB_0017312b:
            pUVar4 = UtestShell::getCurrent();
            (*pUVar4->_vptr_UtestShell[0x1b])
                      (pUVar4,
                       "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                       ,0x338);
          }
        }
        pUVar4 = UtestShell::getCurrent();
        StringFrom(value);
        pcVar5 = SimpleString::asCharString(&local_b8);
        for (; r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0;
            r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (&(r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
                 [(int)r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_color
                  < 0xc]) {
        }
        StringFrom((unsigned_long)&local_b0);
        pcVar6 = SimpleString::asCharString(&local_b0);
        local_a8.super_TestTerminator._vptr_TestTerminator =
             (TestTerminator)&PTR_exitCurrentTest_001e18b8;
        (*pUVar4->_vptr_UtestShell[0x16])
                  (pUVar4,1,pcVar5,pcVar6,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x338,&local_a8);
        TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
        SimpleString::~SimpleString(&local_b0);
        SimpleString::~SimpleString(&local_b8);
        goto LAB_00172c0b;
      }
    }
  }
  pUVar4 = UtestShell::getCurrent();
  local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0,0,0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
             ,0x338,&local_b8);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
            ((TestTerminatorWithoutExceptions *)&local_b8);
LAB_00172c0b:
  if (r.doubling_factor == 100) {
    pUVar4 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x339,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_b8);
    StringFrom((int)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x339,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&r.patterns._M_t);
  if (r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(r.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&r.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&r);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, BigThreeDragons)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::WhiteDragon, true);
	addTriplet(Tile::RedDragon, false);
	addTriplet(Tile::GreenDragon, false);
	addSequence(Tile::TwoOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::BigThreeDragons));
	CHECK_EQUAL(0, r.patterns.count(Pattern::WhiteDragon));
	CHECK_EQUAL(0, r.patterns.count(Pattern::RedDragon));
	CHECK_EQUAL(0, r.patterns.count(Pattern::GreenDragon));
	CHECK_EQUAL(100, r.doubling_factor);
}